

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_expr.cpp
# Opt level: O3

double __thiscall nivalis::Expr::operator()(Expr *this,double arg,Environment *env)

{
  initializer_list<double> __l;
  allocator_type local_41;
  double local_40;
  vector<double,_std::allocator<double>_> local_38;
  double local_20;
  
  __l._M_len = 1;
  __l._M_array = &local_20;
  local_20 = arg;
  std::vector<double,_std::allocator<double>_>::vector(&local_38,__l,&local_41);
  local_40 = detail::eval_ast(env,&this->ast,&local_38);
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_40;
}

Assistant:

double Expr::operator()(double arg, Environment& env) const {
    return detail::eval_ast(env, ast, {arg});
}